

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

int stbi_png_test_file(FILE *f)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  lVar2 = ftell((FILE *)f);
  lVar4 = 0;
  while( true ) {
    uVar1 = 0;
    if (f != (FILE *)0x0) {
      uVar1 = fgetc((FILE *)f);
      if (uVar1 == 0xffffffff) {
        uVar1 = 0;
      }
    }
    if (uVar1 != (byte)(&check_png_header_png_sig)[lVar4]) break;
    lVar4 = lVar4 + 1;
    if (lVar4 == 8) {
      iVar3 = 1;
LAB_001c02ef:
      fseek((FILE *)f,(long)(int)lVar2,0);
      return iVar3;
    }
  }
  failure_reason = "Not a PNG";
  iVar3 = 0;
  goto LAB_001c02ef;
}

Assistant:

int stbi_png_test_file(FILE *f)
{
   png p;
   int n,r;
   n = ftell(f);
   start_file(&p.s, f);
   r = parse_png_file(&p, SCAN_type,STBI_default);
   fseek(f,n,SEEK_SET);
   return r;
}